

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall xmrig::Network::onConfigChanged(Network *this,Config *config,Config *previousConfig)

{
  bool bVar1;
  size_t sVar2;
  IStrategy *pIVar3;
  Pools *this_00;
  
  this_00 = &(config->super_BaseConfig).m_pools;
  bVar1 = Pools::isEqual(this_00,&(previousConfig->super_BaseConfig).m_pools);
  if (!bVar1) {
    sVar2 = Pools::active(this_00);
    if (sVar2 != 0) {
      (*this->m_strategy->_vptr_IStrategy[7])();
      Pools::print(this_00);
      if (this->m_strategy != (IStrategy *)0x0) {
        (*this->m_strategy->_vptr_IStrategy[1])();
      }
      pIVar3 = Pools::createStrategy(this_00,&this->super_IStrategyListener);
      this->m_strategy = pIVar3;
      (*pIVar3->_vptr_IStrategy[5])(pIVar3);
      return;
    }
  }
  return;
}

Assistant:

void xmrig::Network::onConfigChanged(Config *config, Config *previousConfig)
{
    if (config->pools() == previousConfig->pools() || !config->pools().active()) {
        return;
    }

    m_strategy->stop();

    config->pools().print();

    delete m_strategy;
    m_strategy = config->pools().createStrategy(this);
    connect();
}